

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O3

wchar_t prompt_for_easy_filter(equippable_summary *s,_Bool apply_not)

{
  wchar_t wVar1;
  equippable_expr *peVar2;
  equippable_expr *peVar3;
  uint uVar4;
  bool bVar5;
  undefined4 uVar6;
  equippable_selfunc_extra eVar7;
  _Bool _Var8;
  wchar_t wVar9;
  wchar_t extraout_EAX;
  wchar_t wVar10;
  undefined7 extraout_var;
  __int32_t **pp_Var11;
  __int32_t *p_Var12;
  size_t sVar13;
  code *pcVar14;
  wchar_t wVar15;
  undefined1 *puVar16;
  code *pcVar17;
  char cVar18;
  bool bVar19;
  long lVar20;
  undefined7 in_register_00000031;
  undefined1 *puVar21;
  ulong uVar22;
  wchar_t *pwVar23;
  int iVar24;
  prop_category *ppVar25;
  char c [4];
  wchar_t wc [4];
  wchar_t wce [4];
  char local_94;
  undefined1 local_93 [3];
  char local_90 [4];
  int local_8c;
  prop_category *local_88;
  undefined4 local_7c;
  wchar_t local_78;
  wchar_t local_74;
  int local_70;
  equippable_summary *local_60;
  wchar_t local_58;
  wchar_t local_54;
  int local_50;
  wchar_t *local_40;
  ulong local_38;
  
  local_90[0] = '\0';
  local_90[1] = '\0';
  local_90[2] = '\0';
  local_90[3] = '\0';
  _Var8 = get_string("Enter 2 or 3 (for stat) character code and return or return to clear ",
                     local_90,4);
  wVar9 = (wchar_t)CONCAT71(extraout_var,_Var8);
  if (_Var8) {
    if (local_90[0] != '\0') {
      local_7c = (undefined4)CONCAT71(in_register_00000031,apply_not);
      local_88 = s->propcats;
      local_40 = &s->propcats[0].n;
      bVar5 = false;
      lVar20 = (long)local_90[0];
      uVar22 = 0;
      local_60 = s;
      pp_Var11 = __ctype_toupper_loc();
      local_94 = (char)(*pp_Var11)[lVar20];
      lVar20 = (long)local_90[1];
      if (lVar20 == 0) goto LAB_001ccbfe;
      pp_Var11 = __ctype_tolower_loc();
      p_Var12 = *pp_Var11;
      local_93[0] = (undefined1)p_Var12[lVar20];
      do {
        puVar16 = local_93 + 1;
        puVar21 = local_93 + 2;
        cVar18 = local_90[2];
        bVar19 = true;
        if (local_90[2] != '\0') goto LAB_001ccc41;
LAB_001ccc52:
        *puVar16 = 0;
        local_38 = uVar22;
        sVar13 = text_mbstowcs(&local_78,&local_94,L'\x04');
        if (sVar13 != 0xffffffffffffffff) {
          local_8c = 0;
          bVar19 = true;
          iVar24 = 0;
          pwVar23 = local_40;
          ppVar25 = local_88;
          do {
            lVar20 = (long)iVar24;
            while (wVar9 = (wchar_t)lVar20, wVar9 < *pwVar23) {
              if (!bVar5) {
                if ((local_78 != *ppVar25->labels[lVar20]) ||
                   (local_74 != ppVar25->labels[lVar20][1])) {
                  iVar24 = wVar9 + L'\x01';
                  goto LAB_001ccd10;
                }
LAB_001ccd7d:
                s = local_60;
                local_60->config_filt_is_on = false;
                wVar1 = (local_60->easy_filt).nv;
                wVar10 = get_expected_easy_filter_count(local_60->stores);
                wVar15 = (s->easy_filt).nv;
                peVar3 = (s->easy_filt).v;
                if (wVar1 == wVar10) {
                  peVar3[wVar15].c = EQUIP_EXPR_SELECTOR;
                  wVar15 = wVar15 + L'\x01';
                  (s->easy_filt).nv = wVar15;
                }
                peVar3[wVar15 + L'\xffffffff'].s.ex.src = wVar9 + local_88[local_8c].off;
                switch(local_8c) {
                case 0:
                  pcVar17 = sel_does_not_resist;
                  pcVar14 = sel_at_least_resists;
                  break;
                case 1:
                  pcVar17 = sel_does_not_have_flag;
                  pcVar14 = sel_has_flag;
                  break;
                case 2:
                  pcVar17 = sel_has_flag;
                  pcVar14 = sel_does_not_have_flag;
                  break;
                case 3:
                case 4:
                  pcVar17 = sel_has_nonpos_mod;
                  pcVar14 = sel_has_pos_mod;
                  break;
                default:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-equip-cmp.c"
                                ,0x59f,
                                "int prompt_for_easy_filter(struct equippable_summary *, _Bool)");
                }
                if ((char)local_7c != '\0') {
                  pcVar14 = pcVar17;
                }
                (s->easy_filt).v[wVar15 + L'\xffffffff'].s.func = pcVar14;
                goto code_r0x001ccb43;
              }
              get_ui_entry_label(ppVar25->entries[lVar20],L'\x04',false,&local_58);
              if (((local_78 == local_58) && (local_74 == local_54)) && (local_70 == local_50))
              goto LAB_001ccd7d;
              lVar20 = lVar20 + 1;
              if (!bVar19) goto LAB_001ccd37;
            }
            local_8c = local_8c + 1;
            iVar24 = 0;
LAB_001ccd10:
            ppVar25 = local_88 + local_8c;
            pwVar23 = &local_88[local_8c].n;
            bVar19 = local_8c < 5;
          } while (local_8c < 5);
        }
LAB_001ccd37:
        uVar4 = (uint)local_38;
        uVar22 = (ulong)(uVar4 + 1);
        if ((2 < uVar4) || ((bool)(uVar4 + 1 == 3 & bVar5))) {
          local_60->dlg_trans_msg = "Did not find attribute with that name; filter unchanged";
          return L'\x0027a70b';
        }
        lVar20 = (long)local_90[0];
        switch(uVar4) {
        case 0:
          pp_Var11 = __ctype_toupper_loc();
          break;
        case 1:
          pp_Var11 = __ctype_tolower_loc();
          break;
        case 2:
          goto switchD_001ccd70_caseD_2;
        }
        p_Var12 = *pp_Var11;
        local_94 = (char)p_Var12[lVar20];
        if ((long)local_90[1] == 0) {
LAB_001ccbfe:
          puVar16 = local_93;
          goto LAB_001ccc52;
        }
        local_93[0] = (undefined1)p_Var12[local_90[1]];
      } while( true );
    }
    s->config_filt_is_on = false;
    wVar1 = (s->easy_filt).nv;
    wVar9 = get_expected_easy_filter_count(s->stores);
    if (wVar9 < wVar1) {
      peVar2 = (s->easy_filt).v;
      lVar20 = (long)(s->easy_filt).nv;
      uVar6 = *(undefined4 *)&peVar2[lVar20].field_0x14;
      peVar2[lVar20 + -1].c = peVar2[lVar20].c;
      *(undefined4 *)&peVar2[lVar20 + -1].field_0x14 = uVar6;
      peVar3 = peVar2 + lVar20;
      eVar7 = (peVar3->s).ex;
      uVar6 = *(undefined4 *)&(peVar3->s).field_0xc;
      peVar2 = peVar2 + lVar20 + -1;
      (peVar2->s).func = (peVar3->s).func;
      (peVar2->s).ex = eVar7;
      *(undefined4 *)&(peVar2->s).field_0xc = uVar6;
      pwVar23 = &(s->easy_filt).nv;
      *pwVar23 = *pwVar23 + L'\xffffffff';
code_r0x001ccb43:
      filter_items(s);
      sort_dat_0 = s->items;
      sort_dat_1 = (&s->default_sort)[s->config_sort_is_on].v;
      sort(s->sorted_indices,(long)s->nfilt,4,cmp_for_sort_items);
      wVar9 = extraout_EAX;
    }
  }
  return wVar9;
switchD_001ccd70_caseD_2:
  pp_Var11 = __ctype_tolower_loc();
  local_94 = (char)(*pp_Var11)[lVar20];
  cVar18 = local_90[1];
  puVar16 = local_93;
  if (local_90[1] != '\0') {
    pp_Var11 = __ctype_toupper_loc();
    p_Var12 = *pp_Var11;
    puVar21 = local_93 + 1;
    bVar19 = bVar5;
LAB_001ccc41:
    bVar5 = bVar19;
    *puVar16 = (char)p_Var12[cVar18];
    puVar16 = puVar21;
  }
  goto LAB_001ccc52;
}

Assistant:

static int prompt_for_easy_filter(struct equippable_summary *s, bool apply_not)
{
	static const char *no_matching_attribute_msg =
		"Did not find attribute with that name; filter unchanged";
	char c[4] = "";
	int itry;
	bool threec;

	if (! get_string("Enter 2 or 3 (for stat) character code and return or return to clear ", c,
		N_ELEMENTS(c))) {
		return EQUIP_CMP_MENU_NEW_PAGE;
	}

	/* Clear the current filter. */
	if (c[0] == '\0') {
		s->config_filt_is_on = false;
		if (s->easy_filt.nv >
				get_expected_easy_filter_count(s->stores)) {
			s->easy_filt.v[s->easy_filt.nv - 1] =
				s->easy_filt.v[s->easy_filt.nv];
			--s->easy_filt.nv;
			filter_items(s);
			sort_items(s);
		}
		return EQUIP_CMP_MENU_NEW_PAGE;
	}

	/*
	 * Try different combinations of capitalization to match the
	 * entered string to one of the column labels.
	 */
	itry = 0;
	threec = false;
	while (1) {
		char ctry[4];
		wchar_t wc[4];

		if (itry >= 4 || (threec && itry >= 3)) {
			s->dlg_trans_msg = no_matching_attribute_msg;
			break;
		}
		switch (itry) {
		case 0:
			ctry[0] = toupper(c[0]);
			if (c[1] != '\0') {
				ctry[1] = tolower(c[1]);
				if (c[2] != '\0') {
					ctry[2] = tolower(c[2]);
					ctry[3] = '\0';
					threec = true;
				} else {
					ctry[2] = '\0';
				}
			} else {
				ctry[1] = '\0';
			}
			break;

		case 1:
			ctry[0] = toupper(c[0]);
			if (c[1] != '\0') {
				ctry[1] = toupper(c[1]);
				if (c[2] != '\0') {
					ctry[2] = toupper(c[2]);
					ctry[3] = '\0';
					threec = true;
				} else {
					ctry[2] = '\0';
				}
			} else {
				ctry[1] = '\0';
			}
			break;

		case 2:
			ctry[0] = tolower(c[0]);
			if (c[1] != '\0') {
				ctry[1] = tolower(c[1]);
				if (c[2] != '\0') {
					ctry[2] = tolower(c[2]);
					ctry[3] = '\0';
					threec = true;
				} else {
					ctry[2] = '\0';
				}
			} else {
				ctry[1] = '\0';
			}
			break;

		case 3:
			ctry[0] = tolower(c[0]);
			if (c[1] != '\0') {
				ctry[1] = toupper(c[1]);
				ctry[2] = '\0';
			} else {
				ctry[1] = '\0';
			}
			break;
		}

		if (text_mbstowcs(wc, ctry, N_ELEMENTS(wc)) != (size_t)-1) {
			int j = 0, k = 0;
			bool search = true;

			while (search) {
				if (j < (int)N_ELEMENTS(s->propcats)) {
					if (k < s->propcats[j].n) {
						if (threec) {
							wchar_t wce[4];

							get_ui_entry_label(s->propcats[j].entries[k], 4, false, wce);
							if (wc[0] == wce[0] &&
							    wc[1] == wce[1] &&
							    wc[2] == wce[2]) {
								search = false;
							} else {
								++k;
							}
						} else if (wc[0] == s->propcats[j].labels[k][0] &&
							wc[1] == s->propcats[j].labels[k][1]) {
							search = false;
						} else {
							++k;
						}
					} else {
						k = 0;
						++j;
					}
				} else {
					search = false;
				}
			}

			/* Configure the new filter and apply it. */
			if (j < (int)N_ELEMENTS(s->propcats)) {
				int ind;

				s->config_filt_is_on = false;
				if (s->easy_filt.nv ==
						get_expected_easy_filter_count(s->stores)) {
					s->easy_filt.v[s->easy_filt.nv].c =
						EQUIP_EXPR_SELECTOR;
					++s->easy_filt.nv;
				}
				ind = s->easy_filt.nv - 1;
				s->easy_filt.v[ind].s.ex.propind =
					s->propcats[j].off + k;
				switch (j) {
				case 0:
					/* Resistance */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_does_not_resist :
						sel_at_least_resists;
					break;

				case 1:
					/*
					 * A boolean flag where on is usually
					 * preferred.
					 */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_does_not_have_flag :
						sel_has_flag;
					break;

				case 2:
					/*
					 * A boolean flag where off is usually
					 * preferred.
					 */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_has_flag :
						sel_does_not_have_flag;
					break;

				case 3:
				case 4:
					/* Integer modifier. */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_has_nonpos_mod :
						sel_has_pos_mod;
					break;

				default:
					assert(0);
				}

				filter_items(s);
				sort_items(s);
				break;
			}
		}

		++itry;
	}
	return EQUIP_CMP_MENU_NEW_PAGE;
}